

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O2

void __thiscall
duckdb::RowVersionManager::CommitAppend
          (RowVersionManager *this,transaction_t commit_id,idx_t row_group_start,idx_t count)

{
  size_type __n;
  ulong uVar1;
  reference this_00;
  type pCVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if (count != 0) {
    ::std::mutex::lock(&this->version_lock);
    uVar1 = (count + row_group_start) - 1;
    uVar3 = uVar1 >> 0xb;
    for (lVar6 = 0; __n = (row_group_start >> 0xb) + lVar6, __n <= uVar3; lVar6 = lVar6 + 1) {
      uVar5 = 0;
      if (lVar6 == 0) {
        uVar5 = (ulong)((uint)row_group_start & 0x7ff);
      }
      lVar4 = 0x800;
      if (((row_group_start >> 0xb) - uVar3) + lVar6 == 0) {
        lVar4 = (count + row_group_start) - (uVar1 & 0xfffffffffffff800);
      }
      this_00 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                ::get<true>(&this->vector_info,__n);
      pCVar2 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::
               operator*(this_00);
      (*pCVar2->_vptr_ChunkInfo[5])(pCVar2,commit_id,uVar5,lVar4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  return;
}

Assistant:

void RowVersionManager::CommitAppend(transaction_t commit_id, idx_t row_group_start, idx_t count) {
	if (count == 0) {
		return;
	}
	idx_t row_group_end = row_group_start + count;

	lock_guard<mutex> lock(version_lock);
	idx_t start_vector_idx = row_group_start / STANDARD_VECTOR_SIZE;
	idx_t end_vector_idx = (row_group_end - 1) / STANDARD_VECTOR_SIZE;
	for (idx_t vector_idx = start_vector_idx; vector_idx <= end_vector_idx; vector_idx++) {
		idx_t vstart = vector_idx == start_vector_idx ? row_group_start - start_vector_idx * STANDARD_VECTOR_SIZE : 0;
		idx_t vend =
		    vector_idx == end_vector_idx ? row_group_end - end_vector_idx * STANDARD_VECTOR_SIZE : STANDARD_VECTOR_SIZE;
		auto &info = *vector_info[vector_idx];
		info.CommitAppend(commit_id, vstart, vend);
	}
}